

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InteractionCostCalculator.cpp
# Opt level: O0

void __thiscall
multi_agent_planning::InteractionCostCalculator::InteractionCostCalculator
          (InteractionCostCalculator *this,Scenario *scenario,
          vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_> *plans,
          int agent_id,float alpha)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  const_reference this_00;
  mapped_type *this_01;
  tuple<int,_multi_agent_planning::PlannedAction,_int> local_f8;
  reference local_b8;
  Interaction *interaction;
  iterator __end3;
  iterator __begin3;
  vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>
  *__range3;
  undefined1 local_68 [8];
  vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>
  interactions;
  PlannedAction *a;
  const_iterator __end2;
  const_iterator __begin2;
  vector<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
  *__range2;
  float local_28;
  int i;
  float alpha_local;
  int agent_id_local;
  vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_> *plans_local;
  Scenario *scenario_local;
  InteractionCostCalculator *this_local;
  
  local_28 = alpha;
  i = agent_id;
  _alpha_local = plans;
  plans_local = (vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_> *)
                scenario;
  scenario_local = (Scenario *)this;
  std::
  map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<std::tuple<int,_multi_agent_planning::PlannedAction,_int>,_std::allocator<std::tuple<int,_multi_agent_planning::PlannedAction,_int>_>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<std::tuple<int,_multi_agent_planning::PlannedAction,_int>,_std::allocator<std::tuple<int,_multi_agent_planning::PlannedAction,_int>_>_>_>_>_>
  ::map(&this->interactionMap);
  this->alpha = local_28;
  for (__range2._4_4_ = 0; uVar2 = (ulong)__range2._4_4_,
      sVar3 = std::vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>::
              size(_alpha_local), uVar2 < sVar3; __range2._4_4_ = __range2._4_4_ + 1) {
    if (__range2._4_4_ != i) {
      this_00 = std::vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
                ::operator[](_alpha_local,(long)__range2._4_4_);
      __end2 = std::
               vector<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
               ::begin(&this_00->actions);
      a = (PlannedAction *)
          std::
          vector<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
          ::end(&this_00->actions);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_multi_agent_planning::PlannedAction_*,_std::vector<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>_>
                                         *)&a), bVar1) {
        interactions.
        super__Vector_base<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)__gnu_cxx::
                      __normal_iterator<const_multi_agent_planning::PlannedAction_*,_std::vector<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>_>
                      ::operator*(&__end2);
        Scenario::getInteractionsOnAgent
                  ((vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>
                    *)local_68,scenario,__range2._4_4_,
                   *(Edge *)interactions.
                            super__Vector_base<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,i);
        __end3 = std::
                 vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>
                 ::begin((vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>
                          *)local_68);
        interaction = (Interaction *)
                      std::
                      vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>
                      ::end((vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>
                             *)local_68);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<multi_agent_planning::Interaction_*,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>_>
                                           *)&interaction), bVar1) {
          local_b8 = __gnu_cxx::
                     __normal_iterator<multi_agent_planning::Interaction_*,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>_>
                     ::operator*(&__end3);
          this_01 = std::
                    map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<std::tuple<int,_multi_agent_planning::PlannedAction,_int>,_std::allocator<std::tuple<int,_multi_agent_planning::PlannedAction,_int>_>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<std::tuple<int,_multi_agent_planning::PlannedAction,_int>,_std::allocator<std::tuple<int,_multi_agent_planning::PlannedAction,_int>_>_>_>_>_>
                    ::operator[](&this->interactionMap,&local_b8->actionB);
          std::make_tuple<int&,multi_agent_planning::PlannedAction_const&,int_const&>
                    (&local_f8,(int *)((long)&__range2 + 4),
                     (PlannedAction *)
                     interactions.
                     super__Vector_base<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_b8->cost);
          std::
          vector<std::tuple<int,_multi_agent_planning::PlannedAction,_int>,_std::allocator<std::tuple<int,_multi_agent_planning::PlannedAction,_int>_>_>
          ::push_back(this_01,&local_f8);
          __gnu_cxx::
          __normal_iterator<multi_agent_planning::Interaction_*,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>_>
          ::operator++(&__end3);
        }
        std::
        vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>
        ::~vector((vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>
                   *)local_68);
        __gnu_cxx::
        __normal_iterator<const_multi_agent_planning::PlannedAction_*,_std::vector<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>_>
        ::operator++(&__end2);
      }
    }
  }
  return;
}

Assistant:

InteractionCostCalculator::InteractionCostCalculator(Scenario scenario, 
																										const std::vector<Plan>& plans,
																										int agent_id,
																										float alpha) : alpha(alpha) {
	for (int i = 0; i < plans.size(); ++i) {

		if (i == agent_id) continue;

		for (auto const& a: plans[i].actions) {

			vector<Interaction> interactions = scenario.getInteractionsOnAgent(i, a.edge, agent_id);

			for (auto const& interaction : interactions) {
					// cout << interaction.toString() << endl;
					interactionMap[interaction.actionB].push_back(make_tuple(i, a, interaction.cost));
			}

		}
	}
}